

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  BYTE *src;
  void *src_00;
  void *pvVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  ZSTD_DDict *pZVar10;
  char *pcVar11;
  size_t sVar12;
  ZSTD_dStage ZVar13;
  ulong uVar14;
  void *pvVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  void *src_01;
  void *pvVar20;
  ulong uVar21;
  ZSTD_frameSizeInfo ZVar22;
  void *local_b8;
  
  uVar4 = input->pos;
  uVar5 = input->size;
  sVar16 = 0xffffffffffffffb8;
  if (uVar4 <= uVar5) {
    uVar6 = output->pos;
    uVar7 = output->size;
    sVar16 = 0xffffffffffffffba;
    if (uVar6 <= uVar7) {
      src_00 = (void *)((long)input->src + uVar4);
      pvVar15 = (void *)((long)input->src + uVar5);
      pvVar8 = output->dst;
      pvVar1 = (void *)(uVar6 + (long)pvVar8);
      src = zds->headerBuffer;
      local_b8 = pvVar1;
      src_01 = src_00;
LAB_0014c769:
      uVar9 = (long)pvVar8 + (uVar7 - (long)local_b8);
LAB_0014c779:
      switch(zds->streamStage) {
      case zdss_init:
        zds->streamStage = zdss_loadHeader;
        zds->inPos = 0;
        zds->legacyVersion = 0;
        zds->hostageByte = 0;
        zds->lhSize = 0;
        zds->outStart = 0;
        zds->outEnd = 0;
        sVar16 = 0;
        break;
      case zdss_loadHeader:
        sVar16 = zds->lhSize;
        break;
      case zdss_read:
        goto switchD_0014c798_caseD_2;
      case zdss_load:
        sVar16 = zds->expected;
        goto LAB_0014ca41;
      case zdss_flush:
        goto switchD_0014c798_caseD_4;
      default:
        return 0xffffffffffffffff;
      }
      sVar16 = ZSTD_getFrameHeader_advanced(&zds->fParams,src,sVar16,zds->format);
      if (0xffffffffffffff88 < sVar16) {
        return sVar16;
      }
      if (sVar16 == 0) {
        uVar17 = (zds->fParams).frameContentSize;
        if (((uVar17 != 0) && ((zds->fParams).windowSize != 0)) && (uVar17 <= uVar9)) {
          ZVar22 = ZSTD_findFrameSizeInfo(src_00,uVar5 - uVar4);
          uVar17 = ZVar22.compressedSize;
          if (uVar5 - uVar4 < uVar17) goto LAB_0014c881;
          pZVar10 = ZSTD_getDDict(zds);
          sVar16 = ZSTD_decompressMultiFrame(zds,local_b8,uVar9,src_00,uVar17,(void *)0x0,0,pZVar10)
          ;
          if (0xffffffffffffff88 < sVar16) {
            return sVar16;
          }
          src_01 = (void *)(uVar17 + (long)src_00);
          local_b8 = (void *)((long)local_b8 + sVar16);
          zds->expected = 0;
LAB_0014cd43:
          zds->streamStage = zdss_init;
          pvVar20 = src_01;
          goto LAB_0014cd51;
        }
LAB_0014c881:
        pZVar10 = ZSTD_getDDict(zds);
        ZSTD_decompressBegin_usingDDict(zds,pZVar10);
        if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
          uVar17 = (ulong)*(uint *)(zds->headerBuffer + 4);
          ZVar13 = ZSTDds_skipFrame;
        }
        else {
          sVar16 = ZSTD_decodeFrameHeader(zds,src,zds->lhSize);
          if (0xffffffffffffff88 < sVar16) {
            return sVar16;
          }
          ZVar13 = ZSTDds_decodeBlockHeader;
          uVar17 = 3;
        }
        zds->expected = uVar17;
        zds->stage = ZVar13;
        uVar17 = (zds->fParams).windowSize;
        if (uVar17 < 0x401) {
          uVar17 = 0x400;
        }
        (zds->fParams).windowSize = uVar17;
        if (zds->maxWindowSize < uVar17) {
          return 0xfffffffffffffff0;
        }
        uVar2 = (zds->fParams).blockSizeMax;
        if (uVar2 < 5) {
          uVar2 = 4;
        }
        uVar21 = (ulong)uVar2;
        uVar18 = (zds->fParams).frameContentSize;
        uVar14 = 0x20000;
        if (uVar17 < 0x20000) {
          uVar14 = uVar17;
        }
        uVar17 = uVar17 + uVar14 + 0x10;
        if (uVar17 < uVar18) {
          uVar18 = uVar17;
        }
        if ((zds->inBuffSize < uVar21) || (zds->outBuffSize < uVar18)) {
          if (zds->staticSize == 0) {
            ZSTD_free(zds->inBuff,zds->customMem);
            zds->inBuffSize = 0;
            zds->outBuffSize = 0;
            pcVar11 = (char *)ZSTD_malloc(uVar18 + uVar21,zds->customMem);
            zds->inBuff = pcVar11;
            if (pcVar11 == (char *)0x0) {
              return 0xffffffffffffffc0;
            }
          }
          else {
            if (zds->staticSize - 0x271f8 < uVar18 + uVar21) {
              return 0xffffffffffffffc0;
            }
            pcVar11 = zds->inBuff;
          }
          zds->inBuffSize = uVar21;
          zds->outBuff = pcVar11 + uVar21;
          zds->outBuffSize = uVar18;
        }
        zds->streamStage = zdss_read;
switchD_0014c798_caseD_2:
        sVar16 = zds->expected;
        if (sVar16 == 0) goto LAB_0014cd43;
        if ((ulong)((long)pvVar15 - (long)src_01) < sVar16) {
          pvVar20 = pvVar15;
          if (src_01 == pvVar15) goto LAB_0014cd51;
          zds->streamStage = zdss_load;
LAB_0014ca41:
          sVar12 = zds->inPos;
          uVar17 = sVar16 - sVar12;
          ZVar13 = zds->stage;
          if (ZVar13 == ZSTDds_skipFrame) {
            uVar18 = (long)pvVar15 - (long)src_01;
            if (uVar17 < (ulong)((long)pvVar15 - (long)src_01)) {
              uVar18 = uVar17;
            }
          }
          else {
            if (zds->inBuffSize - sVar12 < uVar17) {
              return 0xffffffffffffffec;
            }
            uVar18 = (long)pvVar15 - (long)src_01;
            if (uVar17 < (ulong)((long)pvVar15 - (long)src_01)) {
              uVar18 = uVar17;
            }
            memcpy(zds->inBuff + sVar12,src_01,uVar18);
            sVar12 = zds->inPos;
          }
          src_01 = (void *)((long)src_01 + uVar18);
          zds->inPos = sVar12 + uVar18;
          pvVar20 = src_01;
          if (uVar18 < uVar17) goto LAB_0014cd51;
          sVar12 = ZSTD_decompressContinue
                             (zds,zds->outBuff + zds->outStart,zds->outBuffSize - zds->outStart,
                              zds->inBuff,sVar16);
          if (0xffffffffffffff88 < sVar12) {
            return sVar12;
          }
          zds->inPos = 0;
          if ((ZVar13 == ZSTDds_skipFrame) || (sVar12 != 0)) {
            sVar16 = zds->outStart;
            sVar12 = sVar12 + sVar16;
            zds->outEnd = sVar12;
            zds->streamStage = zdss_flush;
            goto LAB_0014cbc8;
          }
          zds->streamStage = zdss_read;
        }
        else {
          ZVar13 = zds->stage;
          if (ZVar13 == ZSTDds_skipFrame) {
            sVar12 = 0;
          }
          else {
            sVar12 = zds->outBuffSize - zds->outStart;
          }
          sVar12 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,sVar12,src_01,sVar16);
          if (0xffffffffffffff88 < sVar12) {
            return sVar12;
          }
          src_01 = (void *)((long)src_01 + sVar16);
          if ((ZVar13 == ZSTDds_skipFrame) || (sVar12 != 0)) {
            zds->outEnd = zds->outStart + sVar12;
            zds->streamStage = zdss_flush;
          }
        }
      }
      else {
        sVar12 = zds->lhSize;
        uVar17 = sVar16 - sVar12;
        uVar18 = (long)pvVar15 - (long)src_01;
        if (uVar18 < uVar17) {
          if (pvVar15 != src_01) {
            memcpy(src + sVar12,src_01,uVar18);
            sVar12 = uVar18 + zds->lhSize;
            zds->lhSize = sVar12;
          }
          input->pos = input->size;
          sVar19 = 6;
          if (6 < sVar16) {
            sVar19 = sVar16;
          }
          return (sVar19 - sVar12) + 3;
        }
        memcpy(src + sVar12,src_01,uVar17);
        zds->lhSize = sVar16;
        src_01 = (void *)((long)src_01 + uVar17);
      }
      goto LAB_0014c779;
    }
  }
  return sVar16;
switchD_0014c798_caseD_4:
  sVar16 = zds->outStart;
  sVar12 = zds->outEnd;
LAB_0014cbc8:
  uVar18 = sVar12 - sVar16;
  uVar17 = uVar18;
  if (uVar9 < uVar18) {
    uVar17 = uVar9;
  }
  memcpy(local_b8,zds->outBuff + sVar16,uVar17);
  local_b8 = (void *)((long)local_b8 + uVar17);
  sVar16 = uVar17 + zds->outStart;
  zds->outStart = sVar16;
  pvVar20 = src_01;
  if (uVar9 < uVar18) {
LAB_0014cd51:
    uVar9 = (long)pvVar20 - (long)input->src;
    input->pos = uVar9;
    output->pos = (long)local_b8 - (long)output->dst;
    if ((pvVar20 == src_00) && (local_b8 == pvVar1)) {
      iVar3 = zds->noForwardProgress;
      zds->noForwardProgress = iVar3 + 1;
      if (0xe < iVar3) {
        if (uVar6 == uVar7) {
          return 0xffffffffffffffba;
        }
        if (uVar5 == uVar4) {
          return 0xffffffffffffffb8;
        }
      }
    }
    else {
      zds->noForwardProgress = 0;
    }
    if (zds->expected != 0) {
      return (zds->expected - zds->inPos) + (ulong)(zds->stage == ZSTDds_decompressBlock) * 3;
    }
    if (zds->outEnd != zds->outStart) {
      if (zds->hostageByte == 0) {
        input->pos = uVar9 - 1;
        zds->hostageByte = 1;
        return 1;
      }
      return 1;
    }
    if (zds->hostageByte != 0) {
      if (input->size <= uVar9) {
        zds->streamStage = zdss_read;
        return 1;
      }
      input->pos = uVar9 + 1;
    }
    return 0;
  }
  zds->streamStage = zdss_read;
  if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
     (zds->outBuffSize < sVar16 + (zds->fParams).blockSizeMax)) {
    zds->outStart = 0;
    zds->outEnd = 0;
  }
  goto LAB_0014c769;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const istart = (const char*)(input->src) + input->pos;
    const char* const iend = (const char*)(input->src) + input->size;
    const char* ip = istart;
    char* const ostart = (char*)(output->dst) + output->pos;
    char* const oend = (char*)(output->dst) + output->size;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
            zds->legacyVersion = 0;
            zds->hostageByte = 0;
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize));
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX(ZSTD_FRAMEHEADERSIZE_MIN, hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize && zds->fParams.windowSize /* skippable frame if == 0 */
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, iend-istart);
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, oend-op, istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)));

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize));
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge);

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize);
                if ((zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize)) {
                    size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                    DEBUGLOG(4, "inBuff  : from %u to %u",
                                (U32)zds->inBuffSize, (U32)neededInBuffSize);
                    DEBUGLOG(4, "outBuff : from %u to %u",
                                (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                    if (zds->staticSize) {  /* static DCtx */
                        DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                        assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                        RETURN_ERROR_IF(
                            bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                            memory_allocation);
                    } else {
                        ZSTD_free(zds->inBuff, zds->customMem);
                        zds->inBuffSize = 0;
                        zds->outBuffSize = 0;
                        zds->inBuff = (char*)ZSTD_malloc(bufferSize, zds->customMem);
                        RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation);
                    }
                    zds->inBuffSize = neededInBuffSize;
                    zds->outBuff = zds->inBuff + zds->inBuffSize;
                    zds->outBuffSize = neededOutBuffSize;
            }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    int const isSkipFrame = ZSTD_isSkipFrame(zds);
                    size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, (isSkipFrame ? 0 : zds->outBuffSize - zds->outStart),
                        ip, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    ip += neededInSize;
                    if (!decodedSize && !isSkipFrame) break;   /* this was just a header */
                    zds->outEnd = zds->outStart + decodedSize;
                    zds->streamStage = zdss_flush;
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, iend-ip);
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                {   size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, zds->outBuffSize - zds->outStart,
                        zds->inBuff, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    zds->inPos = 0;   /* input is consumed */
                    if (!decodedSize && !isSkipFrame) { zds->streamStage = zdss_read; break; }   /* this was just a header */
                    zds->outEnd = zds->outStart +  decodedSize;
            }   }
            zds->streamStage = zdss_flush;
            /* fall-through */

        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, oend-op, zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC);   /* some compiler require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));
    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, dstSize_tooSmall);
            RETURN_ERROR_IF(ip==iend, srcSize_wrong);
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}